

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlCopyChar(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  int val;
  int len;
  xmlChar *out;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  
  iVar1 = libxml_deprecationWarning("xmlCopyChar");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"izi:xmlCopyChar",&local_1c,&local_18,&local_20);
    if (iVar1 != 0) {
      iVar1 = xmlCopyChar(local_1c,local_18,local_20);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlCopyChar(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    int len;
    xmlChar * out;
    int val;

    if (libxml_deprecationWarning("xmlCopyChar") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"izi:xmlCopyChar", &len, &out, &val))
        return(NULL);

    c_retval = xmlCopyChar(len, out, val);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}